

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O1

Vec_Int_t * Wlc_NtkCollectAddMult(Wlc_Ntk_t *p,Wlc_BstPar_t *pPar,int *pCountA,int *pCountM)

{
  Wlc_Obj_t *pWVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  ushort uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  *pCountM = 0;
  *pCountA = 0;
  if ((pPar->nAdderLimit != 0) || (pPar->nMultLimit != 0)) {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar2 = (int *)malloc(400);
    p_00->pArray = piVar2;
    if (1 < p->iObj) {
      lVar4 = 1;
      lVar7 = 0x24;
      do {
        if (p->nObjsAlloc <= lVar4) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar1 = p->pObjs;
        uVar3 = *(ushort *)((long)pWVar1 + lVar7 + -0xc) & 0x3f;
        if (uVar3 == 0x2d) {
          if (pPar->nMultLimit != 0) {
            iVar5 = *(int *)((long)pWVar1 + lVar7 + -4) - *(int *)(&pWVar1->field_0x0 + lVar7);
            iVar6 = -iVar5;
            if (0 < iVar5) {
              iVar6 = iVar5;
            }
            piVar2 = pCountM;
            if (pPar->nMultLimit <= iVar6 + 1) goto LAB_0037ca43;
          }
        }
        else if ((uVar3 == 0x2b) && (pPar->nAdderLimit != 0)) {
          iVar5 = *(int *)((long)pWVar1 + lVar7 + -4) - *(int *)(&pWVar1->field_0x0 + lVar7);
          iVar6 = -iVar5;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          piVar2 = pCountA;
          if (pPar->nAdderLimit <= iVar6 + 1) {
LAB_0037ca43:
            Vec_IntPush(p_00,(int)lVar4);
            *piVar2 = *piVar2 + 1;
          }
        }
        lVar4 = lVar4 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar4 < p->iObj);
    }
    if (0 < p_00->nSize) {
      Wlc_NtkCollectBoxes(p,p_00);
      return p_00;
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectAddMult( Wlc_Ntk_t * p, Wlc_BstPar_t * pPar, int * pCountA, int * pCountM )
{
    Vec_Int_t * vBoxIds;
    Wlc_Obj_t * pObj;  int i;
    *pCountA = *pCountM = 0;
    if ( pPar->nAdderLimit == 0 && pPar->nMultLimit == 0 )
        return NULL;
    vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD && pPar->nAdderLimit && Wlc_ObjRange(pObj) >= pPar->nAdderLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountA)++;
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI && pPar->nMultLimit && Wlc_ObjRange(pObj) >= pPar->nMultLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountM)++;
    }
    if ( Vec_IntSize( vBoxIds ) > 0 )
    {
        Wlc_NtkCollectBoxes( p, vBoxIds );
        return vBoxIds;
    }
    Vec_IntFree( vBoxIds );
    return NULL;
}